

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbmp.cpp
# Opt level: O0

void BMP_GetPixelRGB(BMP *bmp,unsigned_long x,unsigned_long y,uchar *r,uchar *g,uchar *b)

{
  uchar bytes_per_pixel;
  unsigned_long bytes_per_row;
  uchar *pixel;
  uchar *b_local;
  uchar *g_local;
  uchar *r_local;
  unsigned_long y_local;
  unsigned_long x_local;
  BMP *bmp_local;
  
  if (((bmp == (BMP *)0x0) || ((bmp->Header).Width <= x)) || ((bmp->Header).Height <= y)) {
    BMP_LAST_ERROR_CODE = BMP_INVALID_ARGUMENT;
  }
  else {
    BMP_LAST_ERROR_CODE = BMP_OK;
    bytes_per_row =
         (unsigned_long)
         (bmp->Data +
         (((bmp->Header).Height - y) + -1) * ((bmp->Header).ImageDataSize / (bmp->Header).Height) +
         x * (byte)((int)(uint)(bmp->Header).BitsPerPixel >> 3));
    if ((bmp->Header).BitsPerPixel == 8) {
      bytes_per_row = (unsigned_long)(bmp->Palette + (int)((uint)*(byte *)bytes_per_row << 2));
    }
    if (r != (uchar *)0x0) {
      *r = *(uchar *)(bytes_per_row + 2);
    }
    if (g != (uchar *)0x0) {
      *g = *(uchar *)(bytes_per_row + 1);
    }
    if (b != (uchar *)0x0) {
      *b = *(uchar *)bytes_per_row;
    }
  }
  return;
}

Assistant:

void BMP_GetPixelRGB( BMP* bmp, UINT x, UINT y, UCHAR* r, UCHAR* g, UCHAR* b )
{
	UCHAR*	pixel;
	UINT	bytes_per_row;
	UCHAR	bytes_per_pixel;

	if ( bmp == NULL || x < 0 || x >= bmp->Header.Width || y < 0 || y >= bmp->Header.Height )
	{
		BMP_LAST_ERROR_CODE = BMP_INVALID_ARGUMENT;
	}
	else
	{
		BMP_LAST_ERROR_CODE = BMP_OK;

		bytes_per_pixel = bmp->Header.BitsPerPixel >> 3;

		/* Row's size is rounded up to the next multiple of 4 bytes */
		bytes_per_row = bmp->Header.ImageDataSize / bmp->Header.Height;

		/* Calculate the location of the relevant pixel (rows are flipped) */
		pixel = bmp->Data + ( ( bmp->Header.Height - y - 1 ) * bytes_per_row + x * bytes_per_pixel );


		/* In indexed color mode the pixel's value is an index within the palette */
		if ( bmp->Header.BitsPerPixel == 8 )
		{
			pixel = bmp->Palette + *pixel * 4;
		}

		/* Note: colors are stored in BGR order */
		if ( r )	*r = *( pixel + 2 );
		if ( g )	*g = *( pixel + 1 );
		if ( b )	*b = *( pixel + 0 );
	}
}